

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O2

CborError cbor_encode_floating_point(CborEncoder *encoder,CborType fpType,void *value)

{
  uint uVar1;
  ulong uVar2;
  CborError CVar3;
  long in_FS_OFFSET;
  char local_11;
  undefined8 local_10;
  long local_8;
  
  local_11 = (char)fpType;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (fpType == CborFloatType) {
    uVar1 = *value;
    local_10 = CONCAT44(0xaaaaaaaa,
                        uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18);
  }
  else if (fpType == CborDoubleType) {
    uVar2 = *value;
    local_10 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  }
  else {
    local_10 = CONCAT62(0xaaaaaaaaaaaa,*value << 8 | *value >> 8);
  }
  if (encoder->remaining != 0) {
    encoder->remaining = encoder->remaining - 1;
  }
  CVar3 = append_to_buffer(encoder,&local_11,(ulong)((2 << (local_11 + 7U & 0x1f)) + 1),
                           CborEncoderAppendCborData);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return CVar3;
  }
  __stack_chk_fail();
}

Assistant:

CborError cbor_encode_floating_point(CborEncoder *encoder, CborType fpType, const void *value)
{
    unsigned size;
    uint8_t buf[1 + sizeof(uint64_t)];
    cbor_assert(fpType == CborHalfFloatType || fpType == CborFloatType || fpType == CborDoubleType);
    buf[0] = fpType;

    size = 2U << (fpType - CborHalfFloatType);
    if (size == 8)
        put64(buf + 1, *(const uint64_t*)value);
    else if (size == 4)
        put32(buf + 1, *(const uint32_t*)value);
    else
        put16(buf + 1, *(const uint16_t*)value);
    saturated_decrement(encoder);
    return append_to_buffer(encoder, buf, size + 1, CborEncoderAppendCborData);
}